

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

void __thiscall OpenMD::NonPositiveConstraint::NonPositiveConstraint(NonPositiveConstraint *this)

{
  string *in_RDI;
  
  ParamConstraintFacade<OpenMD::NonPositiveConstraint>::ParamConstraintFacade
            ((ParamConstraintFacade<OpenMD::NonPositiveConstraint> *)0x24f5c8);
  std::__cxx11::string::operator=(in_RDI,"nonpositive");
  return;
}

Assistant:

NonPositiveConstraint() { this->description_ = "nonpositive"; }